

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bstrncmp(bstring b0,bstring b1,int n)

{
  int iVar1;
  int local_30;
  int m;
  int v;
  int i;
  int n_local;
  bstring b1_local;
  bstring b0_local;
  
  if (((((b0 == (bstring)0x0) || (b1 == (bstring)0x0)) || (b0->data == (uchar *)0x0)) ||
      ((b1->data == (uchar *)0x0 || (b0->slen < 0)))) || (b1->slen < 0)) {
    b0_local._4_4_ = -0x8000;
  }
  else {
    local_30 = n;
    if (b0->slen < n) {
      local_30 = b0->slen;
    }
    if (b1->slen < local_30) {
      local_30 = b1->slen;
    }
    if (b0->data != b1->data) {
      for (m = 0; m < local_30; m = m + 1) {
        iVar1 = (int)(char)b0->data[m] - (int)(char)b1->data[m];
        if (iVar1 != 0) {
          return iVar1;
        }
        if (b0->data[m] == '\0') {
          return 0;
        }
      }
    }
    if ((n == local_30) || (b0->slen == b1->slen)) {
      b0_local._4_4_ = 0;
    }
    else if (local_30 < b0->slen) {
      b0_local._4_4_ = 1;
    }
    else {
      b0_local._4_4_ = -1;
    }
  }
  return b0_local._4_4_;
}

Assistant:

int bstrncmp (const bstring b0, const bstring b1, int n) {
int i, v, m;

	if (b0 == NULL || b1 == NULL || b0->data == NULL || b1->data == NULL ||
		b0->slen < 0 || b1->slen < 0) return SHRT_MIN;
	m = n;
	if (m > b0->slen) m = b0->slen;
	if (m > b1->slen) m = b1->slen;

	if (b0->data != b1->data) {
		for (i = 0; i < m; i ++) {
			v = ((char) b0->data[i]) - ((char) b1->data[i]);
			if (v != 0) return v;
			if (b0->data[i] == (unsigned char) '\0') return 0;
		}
	}

	if (n == m || b0->slen == b1->slen) return 0;

	if (b0->slen > m) return 1;
	return -1;
}